

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

substr __thiscall c4::yml::Tree::arena(Tree *this)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  ulong len_;
  substr sVar4;
  substr local_20;
  
  uVar1 = this->m_arena_pos;
  len_ = (this->m_arena).len;
  if (uVar1 == 0xffffffffffffffff || uVar1 <= len_) {
    if (uVar1 != 0xffffffffffffffff) {
      len_ = uVar1;
    }
    basic_substring<char>::basic_substring(&local_20,(this->m_arena).str,len_);
    return local_20;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar3 = is_debugger_attached();
    if (bVar3) {
      pcVar2 = (code *)swi(3);
      sVar4 = (substr)(*pcVar2)();
      return sVar4;
    }
  }
  handle_error(0x230d59,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x154e,"num <= len || num == npos");
}

Assistant:

substr arena() const { return m_arena.first(m_arena_pos); }